

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void UtttHashTest(void)

{
  _Hash_node_base *p_Var1;
  iterator __position;
  pointer pIVar2;
  vector<uttt::IBoard,std::allocator<uttt::IBoard>> *this;
  ostream *poVar3;
  vector<long,_std::allocator<long>_> *__range3;
  __node_base _Var4;
  undefined1 auVar5 [8];
  pointer pIVar6;
  bool bVar7;
  vector<long,_std::allocator<long>_> moves;
  IBoard b2;
  __node_gen_type __node_gen;
  long m;
  unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
  set2;
  unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
  set1;
  IBoard board;
  undefined1 local_158 [8];
  vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> vStack_150;
  ulong local_138;
  uint local_12c;
  _Hashtable<uttt::IBoard,_uttt::IBoard,_std::allocator<uttt::IBoard>,_std::__detail::_Identity,_std::equal_to<uttt::IBoard>,_std::hash<uttt::IBoard>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_128;
  _Hash_node_base *p_Stack_120;
  _Hash_node_base *local_118;
  undefined1 local_108 [64];
  __node_base local_c8;
  _Hashtable<uttt::IBoard,_uttt::IBoard,_std::allocator<uttt::IBoard>,_std::__detail::_Identity,_std::equal_to<uttt::IBoard>,_std::hash<uttt::IBoard>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_c0;
  _Hashtable<uttt::IBoard,_uttt::IBoard,_std::allocator<uttt::IBoard>,_std::__detail::_Identity,_std::equal_to<uttt::IBoard>,_std::hash<uttt::IBoard>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_b8;
  _Hashtable<uttt::IBoard,_uttt::IBoard,_std::allocator<uttt::IBoard>,_std::__detail::_Identity,_std::equal_to<uttt::IBoard>,_std::hash<uttt::IBoard>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_80;
  IBoard local_48;
  
  uttt::IBoard::IBoard(&local_48);
  local_80._M_buckets = &local_80._M_single_bucket;
  local_80._M_bucket_count = 1;
  local_80._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_80._M_element_count = 0;
  local_80._M_rehash_policy._M_max_load_factor = 1.0;
  local_80._M_rehash_policy._M_next_resize = 0;
  local_80._M_single_bucket = (__node_base_ptr)0x0;
  local_b8._M_buckets = &local_b8._M_single_bucket;
  local_b8._M_bucket_count = 1;
  local_b8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b8._M_element_count = 0;
  local_b8._M_rehash_policy._M_max_load_factor = 1.0;
  local_b8._M_rehash_policy._M_next_resize = 0;
  local_b8._M_single_bucket = (__node_base_ptr)0x0;
  local_108._0_8_ = &local_80;
  std::
  _Hashtable<uttt::IBoard,uttt::IBoard,std::allocator<uttt::IBoard>,std::__detail::_Identity,std::equal_to<uttt::IBoard>,std::hash<uttt::IBoard>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_insert<uttt::IBoard_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<uttt::IBoard,true>>>>
            ();
  local_138 = 0;
  _Var4._M_nxt = local_b8._M_before_begin._M_nxt;
  do {
    while (_Var4._M_nxt != (_Hash_node_base *)0x0) {
      p_Var1 = (_Var4._M_nxt)->_M_nxt;
      operator_delete(_Var4._M_nxt);
      _Var4._M_nxt = p_Var1;
    }
    memset(local_b8._M_buckets,0,local_b8._M_bucket_count << 3);
    local_b8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_b8._M_element_count = 0;
    for (_Var4._M_nxt = local_80._M_before_begin._M_nxt; _Var4._M_nxt != (_Hash_node_base *)0x0;
        _Var4._M_nxt = (_Var4._M_nxt)->_M_nxt) {
      local_108._16_8_ = _Var4._M_nxt[3]._M_nxt;
      local_108._0_8_ = _Var4._M_nxt[1]._M_nxt;
      local_108._8_8_ = _Var4._M_nxt[2]._M_nxt;
      uttt::IBoard::GetPossibleMoves
                ((vector<long,_std::allocator<long>_> *)local_158,(IBoard *)local_108);
      pIVar2 = vStack_150.super__Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (auVar5 = local_158; auVar5 != (undefined1  [8])pIVar2;
          auVar5 = (undefined1  [8])((((pointer)auVar5)->micro)._M_elems + 2)) {
        local_c8._M_nxt = *(_Hash_node_base **)auVar5;
        local_118 = (_Hash_node_base *)local_108._16_8_;
        local_128 = (_Hashtable<uttt::IBoard,_uttt::IBoard,_std::allocator<uttt::IBoard>,_std::__detail::_Identity,_std::equal_to<uttt::IBoard>,_std::hash<uttt::IBoard>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)local_108._0_8_;
        p_Stack_120 = (_Hash_node_base *)local_108._8_8_;
        uttt::IBoard::ApplyMove((IBoard *)&local_128,(IMove *)&local_c8);
        local_c0 = &local_b8;
        std::
        _Hashtable<uttt::IBoard,uttt::IBoard,std::allocator<uttt::IBoard>,std::__detail::_Identity,std::equal_to<uttt::IBoard>,std::hash<uttt::IBoard>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<uttt::IBoard_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<uttt::IBoard,true>>>>
                  ((_Hashtable<uttt::IBoard,uttt::IBoard,std::allocator<uttt::IBoard>,std::__detail::_Identity,std::equal_to<uttt::IBoard>,std::hash<uttt::IBoard>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)&local_b8,(IBoard *)&local_128,&local_c0);
      }
      if (local_158 != (undefined1  [8])0x0) {
        operator_delete((void *)local_158);
      }
    }
    std::
    _Hashtable<uttt::IBoard,uttt::IBoard,std::allocator<uttt::IBoard>,std::__detail::_Identity,std::equal_to<uttt::IBoard>,std::hash<uttt::IBoard>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_assign_elements<std::_Hashtable<uttt::IBoard,uttt::IBoard,std::allocator<uttt::IBoard>,std::__detail::_Identity,std::equal_to<uttt::IBoard>,std::hash<uttt::IBoard>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
              ((_Hashtable<uttt::IBoard,uttt::IBoard,std::allocator<uttt::IBoard>,std::__detail::_Identity,std::equal_to<uttt::IBoard>,std::hash<uttt::IBoard>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&local_80,&local_b8);
    local_108._0_8_ = local_108 + 0x30;
    local_108._8_8_ = (_Hash_node_base *)0x1;
    local_108._16_8_ = (_Hash_node_base *)0x0;
    local_108._24_8_ = 0;
    local_108._32_4_ = 1.0;
    local_108._40_8_ = 0;
    local_108._48_8_ = (__node_base_ptr)0x0;
    for (_Var4._M_nxt = local_80._M_before_begin._M_nxt; _Var4._M_nxt != (_Hash_node_base *)0x0;
        _Var4._M_nxt = (_Var4._M_nxt)->_M_nxt) {
      vStack_150.super__Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)_Var4._M_nxt[3]._M_nxt;
      local_158 = (undefined1  [8])_Var4._M_nxt[1]._M_nxt;
      vStack_150.super__Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)_Var4._M_nxt[2]._M_nxt;
      local_128 = (_Hashtable<uttt::IBoard,_uttt::IBoard,_std::allocator<uttt::IBoard>,_std::__detail::_Identity,_std::equal_to<uttt::IBoard>,_std::hash<uttt::IBoard>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)uttt::IBoard::Hash((IBoard *)local_158);
      this = (vector<uttt::IBoard,std::allocator<uttt::IBoard>> *)
             std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)local_108,(key_type *)&local_128);
      __position._M_current = *(IBoard **)(this + 8);
      if (__position._M_current == *(IBoard **)(this + 0x10)) {
        std::vector<uttt::IBoard,std::allocator<uttt::IBoard>>::
        _M_realloc_insert<uttt::IBoard_const&>(this,__position,(IBoard *)local_158);
      }
      else {
        *(pointer *)(((__position._M_current)->micro)._M_elems + 6) =
             vStack_150.super__Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>._M_impl.
             super__Vector_impl_data._M_finish;
        (__position._M_current)->macro = local_158._0_4_;
        ((__position._M_current)->micro)._M_elems[0] = local_158._4_2_;
        ((__position._M_current)->micro)._M_elems[1] = local_158._6_2_;
        *(pointer *)(((__position._M_current)->micro)._M_elems + 2) =
             vStack_150.super__Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>._M_impl.
             super__Vector_impl_data._M_start;
        *(long *)(this + 8) = *(long *)(this + 8) + 0x18;
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"After iteration ",0x10);
    local_12c = (int)local_138 + 1;
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_12c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," set size = ",0xc);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    local_158[0] = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_158,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"hashes size = ",0xe);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    local_158[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_158,1);
    for (p_Var1 = (_Hash_node_base *)local_108._16_8_; p_Var1 != (_Hash_node_base *)0x0;
        p_Var1 = p_Var1->_M_nxt) {
      local_158 = (undefined1  [8])p_Var1[1]._M_nxt;
      std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>::vector
                (&vStack_150,(vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *)(p_Var1 + 2));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Hash family: ",0xd);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      local_128 = (_Hashtable<uttt::IBoard,_uttt::IBoard,_std::allocator<uttt::IBoard>,_std::__detail::_Identity,_std::equal_to<uttt::IBoard>,_std::hash<uttt::IBoard>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)CONCAT71(local_128._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_128,1);
      pIVar2 = vStack_150.super__Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pIVar6 = vStack_150.super__Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>.
                    _M_impl.super__Vector_impl_data._M_start; pIVar6 != pIVar2; pIVar6 = pIVar6 + 1)
      {
        local_118 = *(_Hash_node_base **)((pIVar6->micro)._M_elems + 6);
        local_128 = *(_Hashtable<uttt::IBoard,_uttt::IBoard,_std::allocator<uttt::IBoard>,_std::__detail::_Identity,_std::equal_to<uttt::IBoard>,_std::hash<uttt::IBoard>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      **)pIVar6;
        p_Stack_120 = *(_Hash_node_base **)((pIVar6->micro)._M_elems + 2);
        uttt::IBoard::Print((IBoard *)&local_128);
      }
      if (vStack_150.super__Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vStack_150.super__Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
    }
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)local_108);
    bVar7 = (int)local_138 == 0;
    local_138 = (ulong)local_12c;
    _Var4._M_nxt = local_b8._M_before_begin._M_nxt;
  } while (bVar7);
  std::
  _Hashtable<uttt::IBoard,_uttt::IBoard,_std::allocator<uttt::IBoard>,_std::__detail::_Identity,_std::equal_to<uttt::IBoard>,_std::hash<uttt::IBoard>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_b8);
  std::
  _Hashtable<uttt::IBoard,_uttt::IBoard,_std::allocator<uttt::IBoard>,_std::__detail::_Identity,_std::equal_to<uttt::IBoard>,_std::hash<uttt::IBoard>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_80);
  return;
}

Assistant:

void
UtttHashTest()
{
    uttt::IBoard board;
    std::unordered_set<uttt::IBoard> set1, set2;
    set1.insert(board);
    for (int i = 0; i < 2; ++i)
    {
        set2.clear();
        for (auto b : set1)
        {
            auto moves = b.GetPossibleMoves();
            for (auto m : moves)
            {
                auto b2 = b;
                b2.ApplyMove(m);
                set2.insert(b2);
            }
        }
        set1 = set2;
        std::unordered_map<std::size_t, std::vector<uttt::IBoard>> hashes;
        for (auto b : set1)
            hashes[b.Hash()].push_back(b);
        std::cout << "After iteration " << i + 1 << " set size = " << set1.size() << '\n';
        std::cout << "hashes size = " << hashes.size() << '\n';

        for (auto it : hashes)
        {
            std::cout << "Hash family: " << it.first << '\n';
            for (auto b : it.second)
                b.Print();
        }
    }
}